

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O0

void Test_Template_RecursiveInclude::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  Template *tpl_00;
  allocator local_179;
  string local_178 [32];
  TemplateString local_158;
  TemplateString local_138;
  TemplateString local_118;
  TemplateDictionary local_f8 [8];
  TemplateDictionary dict;
  TemplateString local_88;
  Template *local_68;
  Template *tpl;
  allocator local_49;
  string local_48 [32];
  ctemplate local_28 [8];
  string incname;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"hi {{>INC}} bar\n  {{>INC}}!",&local_49);
  ctemplate::StringToTemplateFile(local_28,(string *)local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  ctemplate::TemplateString::TemplateString(&local_88,(string *)local_28);
  local_68 = (Template *)ctemplate::Template::GetTemplate(&local_88,DO_NOT_STRIP);
  ctemplate::TemplateString::TemplateString(&local_118,"dict");
  ctemplate::TemplateDictionary::TemplateDictionary(local_f8,&local_118,(UnsafeArena *)0x0);
  ctemplate::TemplateString::TemplateString(&local_138,"INC");
  TVar1.length_ = local_138.length_;
  TVar1.ptr_ = local_138.ptr_;
  TVar1.is_immutable_ = local_138.is_immutable_;
  TVar1._17_7_ = local_138._17_7_;
  TVar1.id_ = local_138.id_;
  ctemplate::TemplateDictionary::AddIncludeDictionary(TVar1);
  ctemplate::TemplateString::TemplateString(&local_158,(string *)local_28);
  TVar2.length_ = local_158.length_;
  TVar2.ptr_ = local_158.ptr_;
  TVar2.is_immutable_ = local_158.is_immutable_;
  TVar2._17_7_ = local_158._17_7_;
  TVar2.id_ = local_158.id_;
  ctemplate::TemplateDictionary::SetFilename(TVar2);
  tpl_00 = local_68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_178,"hi hi  bar\n  ! bar\n  hi  bar\n    !!",&local_179);
  ctemplate::AssertExpandIs(tpl_00,local_f8,(string *)local_178,true);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  ctemplate::TemplateDictionary::~TemplateDictionary(local_f8);
  std::__cxx11::string::~string((string *)local_28);
  return;
}

Assistant:

TEST(Template, RecursiveInclude) {
  string incname = StringToTemplateFile("hi {{>INC}} bar\n  {{>INC}}!");
  Template* tpl = Template::GetTemplate(incname, DO_NOT_STRIP);
  TemplateDictionary dict("dict");
  dict.AddIncludeDictionary("INC")->SetFilename(incname);
  // Note the last line is indented 4 spaces instead of 2.  This is
  // because the last sub-include is indented.
  AssertExpandIs(tpl, &dict, "hi hi  bar\n  ! bar\n  hi  bar\n    !!", true);
}